

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Continuation __thiscall wasm::HeapType::getContinuation(HeapType *this)

{
  bool bVar1;
  HeapTypeInfo *pHVar2;
  HeapType *this_local;
  
  bVar1 = isContinuation(this);
  if (!bVar1) {
    __assert_fail("isContinuation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x39a,"Continuation wasm::HeapType::getContinuation() const");
  }
  pHVar2 = anon_unknown_0::getHeapTypeInfo((HeapType)this->id);
  return (Continuation)
         (HeapType)
         (pHVar2->field_9).struct_.fields.
         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

Continuation HeapType::getContinuation() const {
  assert(isContinuation());
  return getHeapTypeInfo(*this)->continuation;
}